

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_protocol.cpp
# Opt level: O0

bool udpdiscovery::impl::SerializeString
               (SerializeDirection direction,string *value,int value_size,BufferView *buffer_view)

{
  bool bVar1;
  char cVar2;
  char *pcVar3;
  int local_2c;
  int i;
  BufferView *buffer_view_local;
  int value_size_local;
  string *value_local;
  SerializeDirection direction_local;
  
  if (direction == kSerialize) {
    BufferView::InsertBack(buffer_view,value,value_size);
  }
  else if (direction == kParse) {
    bVar1 = BufferView::CanRead(buffer_view,value_size);
    if (!bVar1) {
      return false;
    }
    std::__cxx11::string::resize((ulong)value);
    for (local_2c = 0; local_2c < value_size; local_2c = local_2c + 1) {
      cVar2 = BufferView::Read(buffer_view);
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)value);
      *pcVar3 = cVar2;
    }
  }
  return true;
}

Assistant:

bool SerializeString(SerializeDirection direction, std::string* value,
                     int value_size, BufferView* buffer_view) {
  switch (direction) {
    case kSerialize:
      buffer_view->InsertBack(*value, value_size);
      break;

    case kParse:
      if (!buffer_view->CanRead(value_size)) {
        return false;
      }
      value->resize(value_size);
      for (int i = 0; i < (int)value_size; ++i) {
        (*value)[i] = buffer_view->Read();
      }
      break;
  }

  return true;
}